

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

void __thiscall mp::PLPoints::~PLPoints(PLPoints *this)

{
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

bool empty() const { return x_.empty(); }